

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
erase_no_destroy(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *this,map_index_t b,KeyNode *node)

{
  uint uVar1;
  bool bVar2;
  NodeBase *pNVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char *pcVar7;
  iterator tree_it_00;
  TreeIterator tree_it;
  uint local_3c;
  TreeIterator local_38;
  LogMessageFatal local_28 [16];
  
  local_38.node_ =
       (btree_node<absl::lts_20240722::container_internal::map_params<google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*,_std::less<google::protobuf::internal::VariantKey>,_google::protobuf::internal::MapAllocator<std::pair<const_google::protobuf::internal::VariantKey,_google::protobuf::internal::NodeBase_*>_>,_256,_false>_>
        *)0x0;
  local_38.position_ = -1;
  local_3c = b;
  bVar2 = revalidate_if_necessary(this,&local_3c,node,&local_38);
  if (!bVar2) {
    tree_it_00.position_ = local_38.position_;
    tree_it_00.node_ = local_38.node_;
    tree_it_00._12_4_ = 0;
    UntypedMapBase::EraseFromTree(&this->super_UntypedMapBase,local_3c,tree_it_00);
LAB_001c367e:
    (this->super_UntypedMapBase).num_elements_ = (this->super_UntypedMapBase).num_elements_ - 1;
    if ((local_3c == (this->super_UntypedMapBase).index_of_first_non_null_) &&
       (uVar1 = (this->super_UntypedMapBase).num_buckets_, local_3c < uVar1)) {
      uVar4 = (ulong)local_3c;
      do {
        if ((this->super_UntypedMapBase).table_[uVar4] != 0) {
          return;
        }
        uVar4 = uVar4 + 1;
        (this->super_UntypedMapBase).index_of_first_non_null_ = (map_index_t)uVar4;
      } while (uVar1 != uVar4);
    }
    return;
  }
  pNVar3 = (NodeBase *)(this->super_UntypedMapBase).table_[local_3c];
  if ((pNVar3 == (NodeBase *)0x0) || (((ulong)pNVar3 & 1) != 0)) {
    pcVar7 = "TableEntryIsNonEmptyList(b)";
    uVar5 = 0x1b;
    uVar6 = 0x3bc;
  }
  else {
    pNVar3 = EraseFromLinkedList(&node->super_NodeBase,pNVar3);
    if (((ulong)pNVar3 & 1) == 0) {
      (this->super_UntypedMapBase).table_[local_3c] = (TableEntryPtr)pNVar3;
      goto LAB_001c367e;
    }
    pcVar7 = "(reinterpret_cast<uintptr_t>(node) & 1) == 0";
    uVar5 = 0x2c;
    uVar6 = 0x1ac;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/map.h"
             ,uVar6,uVar5,pcVar7);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_28);
}

Assistant:

PROTOBUF_NOINLINE void erase_no_destroy(map_index_t b, KeyNode* node) {
    TreeIterator tree_it;
    const bool is_list = revalidate_if_necessary(b, node, &tree_it);
    if (is_list) {
      ABSL_DCHECK(TableEntryIsNonEmptyList(b));
      auto* head = TableEntryToNode(table_[b]);
      head = EraseFromLinkedList(node, head);
      table_[b] = NodeToTableEntry(head);
    } else {
      EraseFromTree(b, tree_it);
    }
    --num_elements_;
    if (PROTOBUF_PREDICT_FALSE(b == index_of_first_non_null_)) {
      while (index_of_first_non_null_ < num_buckets_ &&
             TableEntryIsEmpty(index_of_first_non_null_)) {
        ++index_of_first_non_null_;
      }
    }
  }